

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpkview.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  FILE *fp;
  CLU *clu;
  int *piVar2;
  char *pcVar3;
  undefined8 uVar4;
  int y_1;
  undefined7 uVar6;
  ulong uVar5;
  int j;
  int i;
  char *pcVar7;
  char *fmt;
  int iVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  bool bVar13;
  LPStatus status;
  int win_h;
  int win_w;
  ulong local_80;
  int local_78;
  int local_74;
  undefined8 local_70;
  SDL_Event event;
  
  app.which_entry = 0;
  app.centered = false;
  app.checkerboard_on = true;
  app.xpk_path = (char *)0x0;
  app.xpk_fp = (FILE *)0x0;
  app.xpk = (XPK *)0x0;
  app.xpkentry = (XPKEntry *)0x0;
  app.xpkentry_tx = (SDL_Texture *)0x0;
  app.entry_rect.x = 0;
  app.entry_rect.y = 0;
  app.entry_rect.w = 0;
  app.entry_rect.h = 0;
  app.checkerboard_rgba = (uint8_t *)0x0;
  if (argc < 3) {
    pcVar7 = "usage: xpkview clufile xpkfile";
LAB_0010240c:
    LPWarn("xpkview",pcVar7);
  }
  else {
    pcVar7 = argv[1];
    app.xpk_path = argv[2];
    fp = fopen(pcVar7,"rb");
    if ((fp == (FILE *)0x0) || (clu = CLU_NewFromFile((FILE *)fp,&status), status != LUNAPURPURA_OK)
       ) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      fmt = "couldn\'t open CLU file: %s: %s";
    }
    else {
      app.xpk_fp = (FILE *)fopen(app.xpk_path,"rb");
      pcVar7 = app.xpk_path;
      if ((FILE *)app.xpk_fp == (FILE *)0x0) {
        piVar2 = __errno_location();
        pcVar3 = strerror(*piVar2);
      }
      else {
        app.xpk = XPK_NewFromFile(app.xpk_fp,&status);
        pcVar7 = app.xpk_path;
        if (status == LUNAPURPURA_OK) {
          XPK_AttachCLU(app.xpk,clu);
          iVar1 = SDL_Init(0x20);
          if (iVar1 == 0) {
            iVar1 = SDL_CreateWindowAndRenderer(0x280,0x1e0,0,&app);
            if (iVar1 == 0) {
              SDL_SetWindowTitle(app.window,"Luna Purpura: XPK Viewer");
              SDL_ShowWindow(app.window);
              app.checkerboard_rgba = (uint8_t *)calloc(4,0x400);
              if (app.checkerboard_rgba != (uint8_t *)0x0) {
                iVar1 = 0;
                for (iVar8 = 0; iVar8 != 0x10; iVar8 = iVar8 + 1) {
                  lVar10 = (long)iVar1;
                  lVar9 = 0;
                  iVar11 = 0x10;
                  lVar12 = lVar10;
                  while (bVar13 = iVar11 != 0, iVar11 = iVar11 + -1, bVar13) {
                    app.checkerboard_rgba[lVar12] = 0xff;
                    app.checkerboard_rgba[lVar12 + 1] = 0xff;
                    app.checkerboard_rgba[lVar12 + 2] = 0xff;
                    app.checkerboard_rgba[lVar12 + 3] = 0xff;
                    lVar12 = lVar12 + 4;
                    lVar9 = lVar9 + 4;
                  }
                  iVar11 = 0x10;
                  while (bVar13 = iVar11 != 0, iVar11 = iVar11 + -1, bVar13) {
                    app.checkerboard_rgba[lVar9 + lVar10] = 0xf0;
                    app.checkerboard_rgba[lVar9 + 1 + lVar10] = 0xf0;
                    app.checkerboard_rgba[lVar9 + 2 + lVar10] = 0xf0;
                    app.checkerboard_rgba[lVar9 + 3 + lVar10] = 0xf0;
                    lVar9 = lVar9 + 4;
                  }
                  iVar1 = iVar1 + (int)lVar9;
                }
                for (iVar8 = 0; iVar8 != 0x10; iVar8 = iVar8 + 1) {
                  lVar10 = (long)iVar1;
                  lVar9 = 0;
                  iVar11 = 0x10;
                  lVar12 = lVar10;
                  while (bVar13 = iVar11 != 0, iVar11 = iVar11 + -1, bVar13) {
                    app.checkerboard_rgba[lVar12] = 0xf0;
                    app.checkerboard_rgba[lVar12 + 1] = 0xf0;
                    app.checkerboard_rgba[lVar12 + 2] = 0xf0;
                    app.checkerboard_rgba[lVar12 + 3] = 0xf0;
                    lVar12 = lVar12 + 4;
                    lVar9 = lVar9 + 4;
                  }
                  iVar11 = 0x10;
                  while (bVar13 = iVar11 != 0, iVar11 = iVar11 + -1, bVar13) {
                    app.checkerboard_rgba[lVar9 + lVar10] = 0xff;
                    app.checkerboard_rgba[lVar9 + 1 + lVar10] = 0xff;
                    app.checkerboard_rgba[lVar9 + 2 + lVar10] = 0xff;
                    app.checkerboard_rgba[lVar9 + 3 + lVar10] = 0xff;
                    lVar9 = lVar9 + 4;
                  }
                  iVar1 = iVar1 + (int)lVar9;
                }
                XPKView_LoadXPKEntry();
                uVar4 = SDL_CreateRGBSurfaceWithFormatFrom
                                  (app.checkerboard_rgba,0x20,0x20,0x20,0x80,0x16762004);
                free(app.checkerboard_rgba);
                app.checkerboard_tx =
                     (SDL_Texture *)SDL_CreateTextureFromSurface(app.renderer,uVar4);
                SDL_FreeSurface(uVar4);
                SDL_GetWindowSize(app.window,&win_w,&win_h);
                uVar5 = 0;
LAB_00102794:
                do {
                  local_80 = uVar5;
                  while (iVar1 = SDL_PollEvent(&event), iVar1 != 0) {
                    uVar6 = (undefined7)(uVar5 >> 8);
                    if (event.type == 0x100) {
                      uVar5 = CONCAT71(uVar6,1);
                      goto LAB_00102794;
                    }
                    if (event.type == 0x300) goto code_r0x001027bb;
                  }
                  SDL_SetRenderDrawColor(app.renderer,0,0,0,0);
                  SDL_RenderClear(app.renderer);
                  if (app.checkerboard_on == true) {
                    for (iVar1 = 0; iVar1 < win_h / 0x20; iVar1 = iVar1 + 1) {
                      iVar11 = 0;
                      for (iVar8 = 0; iVar8 < win_w / 0x20; iVar8 = iVar8 + 1) {
                        local_70 = 0x2000000020;
                        local_78 = iVar11;
                        local_74 = iVar1 << 5;
                        SDL_RenderCopy(app.renderer,app.checkerboard_tx,0,&local_78);
                        iVar11 = iVar11 + 0x20;
                      }
                    }
                  }
                  iVar1 = 0;
                  SDL_RenderCopy(app.renderer,app.xpkentry_tx,0,0x10c1d8);
                  SDL_RenderPresent(app.renderer);
                  SDL_Delay(1);
                  uVar5 = 0;
                  if ((local_80 & 1) != 0) goto LAB_00102479;
                } while( true );
              }
              pcVar7 = "couldn\'t malloc the checkerboard!";
              goto LAB_0010240c;
            }
            uVar4 = SDL_GetError();
            pcVar7 = "Couldn\'t create window and/or renderer: %s";
          }
          else {
            uVar4 = SDL_GetError();
            pcVar7 = "Couldn\'t initialize SDL: %s";
          }
          LPWarn("xpkview",pcVar7,uVar4);
          goto LAB_00102475;
        }
        pcVar3 = LPStatusString(status);
      }
      fmt = "couldn\'t open XPK file: %s: %s";
    }
    LPWarn("xpkview",fmt,pcVar7,pcVar3);
  }
LAB_00102475:
  iVar1 = 1;
LAB_00102479:
  XPKView_Shutdown();
  return iVar1;
code_r0x001027bb:
  if (event.window.data2 == 0x62) {
    app._96_2_ = app._96_2_ ^ 0x100;
  }
  else if (event.window.data2 == 99) {
    XPKView_ToggleCentered();
  }
  else {
    uVar5 = CONCAT71(uVar6,1);
    if (event.window.data2 == 0x71) goto LAB_00102794;
    if (event.window.data2 == 0x4000004f) {
      if ((int)((app.xpk)->n_entries - 1) <= app.which_entry) goto LAB_00102912;
      app.which_entry = app.which_entry + 1;
    }
    else {
      if ((event.window.data2 != 0x40000050) || (app.which_entry < 1)) goto LAB_00102912;
      app.which_entry = app.which_entry + -1;
    }
    XPKView_LoadXPKEntry();
  }
LAB_00102912:
  uVar5 = 0;
  goto LAB_00102794;
}

Assistant:

int
main(int argc, char *argv[])
{
	app.which_entry = 0;
	app.xpk_path = NULL;
	app.xpk_fp = NULL;
	app.checkerboard_rgba = NULL;
	app.xpk = NULL;
	app.xpkentry = NULL;
	app.xpkentry_tx = NULL;
	app.entry_rect = (SDL_Rect){0, 0, 0, 0};
	app.centered = false;
	app.checkerboard_on = true;

	if (argc < 3) {
		LPWarn(MSGPREFIX, "usage: xpkview clufile xpkfile");
		goto fail;
	}

	char *clu_path = argv[1];
	app.xpk_path = argv[2];

	FILE *clu_fp = fopen(clu_path, "rb");
	if (!clu_fp) {
		LPWarn(MSGPREFIX, "couldn't open CLU file: %s: %s", clu_path, strerror(errno));
		goto fail;
	}

	LPStatus status;

	CLU *clu = CLU_NewFromFile(clu_fp, &status);
	if (status != LUNAPURPURA_OK) {
		LPWarn(MSGPREFIX, "couldn't open CLU file: %s: %s", clu_path, strerror(errno));
		goto fail;
	}

	app.xpk_fp = fopen(app.xpk_path, "rb");
	if (!app.xpk_fp) {
		LPWarn(MSGPREFIX, "couldn't open XPK file: %s: %s", app.xpk_path, strerror(errno));
		goto fail;
	}

	app.xpk = XPK_NewFromFile(app.xpk_fp, &status);
	if (status != LUNAPURPURA_OK) {
		LPWarn(MSGPREFIX, "couldn't open XPK file: %s: %s", app.xpk_path, LPStatusString(status));
		goto fail;
	}

	XPK_AttachCLU(app.xpk, clu);

	if (!XPKView_Setup()) {
		goto fail;
	}

	if (!XPKView_CreateCheckerboardPattern()) {
		goto fail;
	}

	XPKView_LoadXPKEntry();

	/* Obtain the checkerboard texture. */
	SDL_Surface *checkerboard_surf = SDL_CreateRGBSurfaceWithFormatFrom(
		app.checkerboard_rgba, 32, 32, 32, 32*4, SDL_PIXELFORMAT_RGBA32
	);
	free(app.checkerboard_rgba);
	app.checkerboard_tx = SDL_CreateTextureFromSurface(app.renderer, checkerboard_surf);
	SDL_FreeSurface(checkerboard_surf);

	if (!XPKView_MainLoop()) {
		goto fail;
	}

	XPKView_Shutdown();
	return EXIT_SUCCESS;

fail:
	XPKView_Shutdown();
	return EXIT_FAILURE;
}